

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::benchmarkFailed(ConsoleReporter *this,string *error)

{
  ostringstream *poVar1;
  TablePrinter *pTVar2;
  Colour colour;
  
  colour.m_moved = false;
  Colour::use(Red);
  pTVar2 = (this->m_tablePrinter)._M_t.
           super___uniq_ptr_impl<Catch::TablePrinter,_std::default_delete<Catch::TablePrinter>_>.
           _M_t.
           super__Tuple_impl<0UL,_Catch::TablePrinter_*,_std::default_delete<Catch::TablePrinter>_>.
           super__Head_base<0UL,_Catch::TablePrinter_*,_false>._M_head_impl;
  poVar1 = &pTVar2->m_oss;
  std::operator<<((ostream *)poVar1,"Benchmark failed (");
  std::operator<<((ostream *)poVar1,(string *)error);
  std::operator<<((ostream *)poVar1,')');
  Catch::operator<<(pTVar2);
  Catch::operator<<(pTVar2);
  Colour::~Colour(&colour);
  return;
}

Assistant:

void ConsoleReporter::benchmarkFailed(std::string const& error) {
	Colour colour(Colour::Red);
    (*m_tablePrinter)
        << "Benchmark failed (" << error << ')'
        << ColumnBreak() << RowBreak();
}